

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

_Bool gear_excise_object(player *p,object *obj)

{
  wchar_t *pwVar1;
  byte *pbVar2;
  byte bVar3;
  player_upkeep *ppVar4;
  int16_t iVar5;
  object *poVar6;
  long lVar7;
  ulong uVar8;
  
  pile_excise(&p->gear_k,obj->known);
  pile_excise(&p->gear,obj);
  bVar3 = obj->number;
  iVar5 = object_weight_one(obj);
  pwVar1 = &p->upkeep->total_weight;
  *pwVar1 = *pwVar1 - (int)iVar5 * (uint)bVar3;
  if ((p->body).count != 0) {
    lVar7 = 0x18;
    uVar8 = 0;
    do {
      poVar6 = slot_object(p,(wchar_t)uVar8);
      if (poVar6 == obj) {
        *(undefined8 *)((long)&((p->body).slots)->next + lVar7) = 0;
        pwVar1 = &p->upkeep->equip_cnt;
        *pwVar1 = *pwVar1 + L'\xffffffff';
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < (p->body).count);
  }
  calc_inventory(p);
  ppVar4 = p->upkeep;
  uVar8._0_4_ = ppVar4->notice;
  uVar8._4_4_ = ppVar4->update;
  ppVar4->notice = (int)(uVar8 | 0x100000001);
  ppVar4->update = (int)((uVar8 | 0x100000001) >> 0x20);
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 6;
  return SUB81(ppVar4,0);
}

Assistant:

static bool gear_excise_object(struct player *p, struct object *obj)
{
	int i;

	pile_excise(&p->gear_k, obj->known);
	pile_excise(&p->gear, obj);

	/* Change the weight */
	p->upkeep->total_weight -= obj->number * object_weight_one(obj);

	/* Make sure it isn't still equipped */
	for (i = 0; i < p->body.count; i++) {
		if (slot_object(p, i) == obj) {
			p->body.slots[i].obj = NULL;
			p->upkeep->equip_cnt--;
		}
	}

	/* Update the gear */
	calc_inventory(p);

	/* Housekeeping */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->notice |= (PN_COMBINE);
	p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	return true;
}